

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::SetLastUsedSegment(JavascriptArray *this,SparseArraySegmentBase *segment)

{
  bool bVar1;
  SegmentBTreeRoot *pSVar2;
  SparseArraySegmentBase *segment_local;
  JavascriptArray *this_local;
  
  bVar1 = HasSegmentMap(this);
  if (bVar1) {
    pSVar2 = Memory::WriteBarrierPtr<Js::SegmentBTreeRoot>::operator->
                       ((WriteBarrierPtr<Js::SegmentBTreeRoot> *)
                        &(this->segmentUnion).lastUsedSegment);
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pSVar2->lastUsedSegment,segment)
    ;
  }
  else {
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&(this->segmentUnion).lastUsedSegment,segment);
  }
  return;
}

Assistant:

void JavascriptArray::SetLastUsedSegment(SparseArraySegmentBase * segment)
    {
        if (HasSegmentMap())
        {
            this->segmentUnion.segmentBTreeRoot->lastUsedSegment = segment;
        }
        else
        {
            this->segmentUnion.lastUsedSegment = segment;
        }
    }